

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

double __thiscall OpenMD::Polynomial<double>::evaluateDerivative(Polynomial<double> *this,double *x)

{
  double dVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  double dVar6;
  double local_18;
  
  p_Var3 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    local_18 = 0.0;
  }
  else {
    dVar1 = *x;
    local_18 = 0.0;
    do {
      _Var2 = p_Var3[1]._M_color;
      dVar6 = 1.0;
      if (1 < (int)_Var2) {
        iVar4 = _Var2 - _S_black;
        dVar6 = 1.0;
        do {
          dVar6 = dVar6 * dVar1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      local_18 = local_18 + (double)(int)_Var2 * dVar6 * (double)p_Var3[1]._M_parent;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return local_18;
}

Assistant:

Real evaluateDerivative(const Real& x) {
      Real result = Real();
      ExponentType exponent;
      CoefficientType coefficient;

      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        exponent    = i->first;
        coefficient = i->second;
        result += fastpow(x, exponent - 1) * coefficient * exponent;
      }

      return result;
    }